

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O3

adt_hkey_t * adt_hnode_find(adt_hnode_t *node,char *key,uint32_t u32Hash)

{
  anon_union_8_2_ea40ae9c_for_child *paVar1;
  uint8_t uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  adt_hkey_t *paVar6;
  
  uVar2 = node->u8Width;
  while (uVar2 == '\x10') {
    paVar1 = &node->child;
    uVar4 = (ulong)((u32Hash >> ((node->u8Depth & 7) << 2) & 0xf) << 4);
    node = (adt_hnode_t *)((long)&paVar1->match->u32Hash + uVar4);
    uVar2 = *(uint8_t *)((long)&paVar1->match->u32Hash + uVar4);
  }
  if (node->u8Cur != 0) {
    lVar5 = 0;
    do {
      if (*(uint32_t *)((long)&((node->child).match)->u32Hash + lVar5) == u32Hash) {
        paVar6 = *(adt_hkey_t **)((long)&((node->child).match)->key + lVar5);
        while( true ) {
          if (paVar6 == (adt_hkey_t *)0x0) {
            return (adt_hkey_t *)0x0;
          }
          iVar3 = strcmp(paVar6->key,key);
          if (iVar3 == 0) break;
          paVar6 = paVar6->next;
        }
        return paVar6;
      }
      lVar5 = lVar5 + 0x10;
    } while ((ulong)node->u8Cur * 0x10 != lVar5);
  }
  return (adt_hkey_t *)0x0;
}

Assistant:

adt_hkey_t * adt_hnode_find(const adt_hnode_t *node, const char *key,uint32_t u32Hash){
	if(node->u8Width == 16){
			uint8_t u8Bucket = (uint8_t) ( (u32Hash >> (node->u8Depth*4)) & 0xF);
			return adt_hnode_find(&node->child.node[u8Bucket],key,u32Hash);
	}
	else{
		int i;
		for(i=0;i<node->u8Cur;i++){
			if(node->child.match[i].u32Hash == u32Hash){
				adt_hkey_t *hkey = node->child.match[i].key;
				while( (hkey) && (strcmp(hkey->key,key)!=0) ){
					hkey = hkey->next;
				}
				return hkey;
			}
		}
	}
	return 0;
}